

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngwrite.c
# Opt level: O0

png_byte png_unpremultiply(png_uint_32 component,png_uint_32 alpha,png_uint_32 reciprocal)

{
  png_uint_32 reciprocal_local;
  png_uint_32 alpha_local;
  png_uint_32 component_local;
  
  if ((component < alpha) && (0x7f < alpha)) {
    if (component == 0) {
      alpha_local._3_1_ = '\0';
    }
    else {
      if (alpha < 0xff7f) {
        reciprocal_local = reciprocal * component + 0x40 >> 7;
      }
      else {
        reciprocal_local = component * 0xff;
      }
      alpha_local._3_1_ =
           (png_byte)
           ((uint)png_sRGB_base[reciprocal_local >> 0xf] +
            ((reciprocal_local & 0x7fff) * (uint)png_sRGB_delta[reciprocal_local >> 0xf] >> 0xc) >>
           8);
    }
  }
  else {
    alpha_local._3_1_ = 0xff;
  }
  return alpha_local._3_1_;
}

Assistant:

static png_byte
png_unpremultiply(png_uint_32 component, png_uint_32 alpha,
    png_uint_32 reciprocal/*from the above macro*/)
{
   /* The following gives 1.0 for an alpha of 0, which is fine, otherwise if 0/0
    * is represented as some other value there is more likely to be a
    * discontinuity which will probably damage compression when moving from a
    * fully transparent area to a nearly transparent one.  (The assumption here
    * is that opaque areas tend not to be 0 intensity.)
    *
    * There is a rounding problem here; if alpha is less than 128 it will end up
    * as 0 when scaled to 8 bits.  To avoid introducing spurious colors into the
    * output change for this too.
    */
   if (component >= alpha || alpha < 128)
      return 255;

   /* component<alpha, so component/alpha is less than one and
    * component*reciprocal is less than 2^31.
    */
   else if (component > 0)
   {
      /* The test is that alpha/257 (rounded) is less than 255, the first value
       * that becomes 255 is 65407.
       * NOTE: this must agree with the PNG_DIV257 macro (which must, therefore,
       * be exact!)  [Could also test reciprocal != 0]
       */
      if (alpha < 65407)
      {
         component *= reciprocal;
         component += 64; /* round to nearest */
         component >>= 7;
      }

      else
         component *= 255;

      /* Convert the component to sRGB. */
      return (png_byte)PNG_sRGB_FROM_LINEAR(component);
   }

   else
      return 0;
}